

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> * __thiscall
kj::_::ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::operator=
          (ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this,
          ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *param_1)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      if ((this->value).ptr.field_1.value.tag == 1) {
        (this->value).ptr.field_1.value.tag = 0;
      }
      if ((this->value).ptr.field_1.value.tag == 2) {
        (this->value).ptr.field_1.value.tag = 0;
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1.value.tag = (param_1->value).ptr.field_1.value.tag;
      uVar1 = (param_1->value).ptr.field_1.value.tag;
      if (uVar1 == 2) {
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x38) =
             *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x38);
        uVar2 = *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 8);
        uVar3 = *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x10);
        uVar4 = *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x18);
        uVar5 = *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x20);
        uVar6 = *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x30);
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x28) =
             *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x28);
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x30) = uVar6;
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x18) = uVar4;
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x20) = uVar5;
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 8) = uVar2;
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x10) = uVar3;
      }
      else if (uVar1 == 1) {
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 8) =
             *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 8);
      }
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    if ((param_1->value).ptr.field_1.value.tag == 1) {
      (param_1->value).ptr.field_1.value.tag = 0;
    }
    if ((param_1->value).ptr.field_1.value.tag == 2) {
      (param_1->value).ptr.field_1.value.tag = 0;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;